

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<int>::Subst_Backward(TPZMatrix<int> *this,TPZFMatrix<int> *B)

{
  long lVar1;
  TPZBaseMatrix *pTVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  long lVar6;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  int64_t i;
  int sum;
  int64_t c;
  int pivot;
  int64_t r;
  int local_44;
  long local_40;
  int local_34;
  long local_30;
  int local_24;
  long local_20;
  TPZBaseMatrix *local_18;
  int local_4;
  
  local_18 = in_RSI;
  iVar5 = TPZBaseMatrix::Rows(in_RSI);
  lVar6 = (**(code **)(*in_RDI + 0x60))();
  if (((iVar5 == lVar6) && ((char)in_RDI[3] != '\0')) && ((char)in_RDI[3] == '\x03')) {
    local_20 = (**(code **)(*in_RDI + 0x60))();
    while (local_20 = local_20 + -1, -1 < local_20) {
      local_24 = (**(code **)(*in_RDI + 0x120))(in_RDI,local_20,local_20);
      for (local_30 = 0; lVar6 = local_30, iVar5 = TPZBaseMatrix::Cols(local_18), lVar6 < iVar5;
          local_30 = local_30 + 1) {
        local_34 = 0;
        local_40 = (**(code **)(*in_RDI + 0x60))();
        while (pTVar2 = local_18, lVar1 = local_20, lVar6 = local_30, local_40 = local_40 + -1,
              local_20 < local_40) {
          iVar3 = (**(code **)(*in_RDI + 0x120))(in_RDI,local_20,local_40);
          iVar4 = (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(local_18,local_40,local_30)
          ;
          local_34 = iVar3 * iVar4 + local_34;
        }
        iVar3 = (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(local_18,local_20,local_30);
        local_44 = (iVar3 - local_34) / local_24;
        (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[0x23])(pTVar2,lVar1,lVar6,&local_44);
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const {
	
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky) return( 0 );
	for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
			//
			TVar sum = 0.0;
			for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
        }
    }
    return( 1 );
}